

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined7 in_register_00000011;
  float fVar7;
  undefined1 auVar8 [16];
  ulong local_98;
  undefined8 local_88;
  undefined8 local_78;
  ulong local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000011,alwaysPass) == 0) {
    if ((this->active).value == true) {
      pmVar1 = &(this->objectTransform).value;
      fVar4 = pmVar1->value[0].field_0.x;
      fVar5 = (this->objectTransform).value.value[0].field_1.y;
      fVar6 = *(float *)&pmVar1->value[0].field_1;
      auVar8._0_4_ = fVar4 * fVar4;
      auVar8._4_4_ = fVar5 * fVar5;
      auVar8._8_8_ = 0;
      auVar8 = vhaddps_avx(auVar8,auVar8);
      fVar2 = (this->objectTransform).value.value[0].field_2.z;
      fVar7 = auVar8._0_4_ + fVar2 * fVar2;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        auVar8 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
        fVar7 = auVar8._0_4_;
        fVar6 = fVar5;
      }
      fVar7 = 1.0 / fVar7;
      local_88 = CONCAT44(fVar6 * fVar7,fVar4 * fVar7);
      local_98 = (ulong)(uint)(fVar2 * fVar7);
    }
    else {
      local_88 = SUB648(ZEXT464(0xbf800000),0);
      local_98 = 0;
    }
    bVar3 = (this->active).value;
    local_68 = (ulong)((uint)(bVar3 & 1) * (int)(this->objectTransform).value.value[3].field_2);
    if (bVar3 == false) {
      local_78 = SUB648(ZEXT464(0x7f800000),0);
    }
    else {
      local_78._0_4_ = (this->objectTransform).value.value[3].field_0;
      local_78._4_4_ = (this->objectTransform).value.value[3].field_1;
    }
  }
  else {
    local_88 = SUB648(ZEXT464(0xbf800000),0);
    local_68 = 0;
    local_78 = SUB648(ZEXT464(0x7f800000),0);
    local_98 = 0;
  }
  std::operator+(&local_38,"u_slicePlaneNormal_",&this->postfix);
  (*p->_vptr_ShaderProgram[9])(local_88,local_98,p,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::operator+(&local_58,"u_slicePlaneCenter_",&this->postfix);
  (*p->_vptr_ShaderProgram[9])(local_78,local_68,p,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    normal = getNormal();
    center = getCenter();
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}